

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void key_schedule_transform_post_ch1hash(ptls_key_schedule_t *sched)

{
  size_t sVar1;
  ptls_hash_context_t *ppVar2;
  ptls_hash_context_t **pppVar3;
  uint8_t prefix [4];
  ptls_hash_context_t *hashes [3];
  uint8_t ch1hash [64];
  
  sVar1 = (sched->hashes[0].algo)->digest_size;
  ppVar2 = sched->hashes[0].ctx;
  pppVar3 = hashes;
  hashes[1] = sched->hashes[0].ctx_outer;
  hashes[2] = (ptls_hash_context_t *)0x0;
  prefix[0] = 0xfe;
  prefix[1] = '\0';
  prefix[2] = '\0';
  prefix[3] = (uint8_t)sVar1;
  hashes[0] = ppVar2;
  while (pppVar3 = pppVar3 + 1, ppVar2 != (st_ptls_hash_context_t *)0x0) {
    (*ppVar2->final)(ppVar2,ch1hash,PTLS_HASH_FINAL_MODE_RESET);
    (*ppVar2->update)(ppVar2,prefix,4);
    (*ppVar2->update)(ppVar2,ch1hash,sVar1);
    ppVar2 = *pppVar3;
  }
  (*ptls_clear_memory)(ch1hash,0x40);
  return;
}

Assistant:

static void key_schedule_transform_post_ch1hash(ptls_key_schedule_t *sched)
{
    size_t digest_size = sched->hashes[0].algo->digest_size;
    ptls_hash_context_t *hashes[3] = {sched->hashes[0].ctx, sched->hashes[0].ctx_outer, NULL};
    uint8_t ch1hash[PTLS_MAX_DIGEST_SIZE];
    uint8_t prefix[4] = {PTLS_HANDSHAKE_TYPE_MESSAGE_HASH, 0, 0, (uint8_t)digest_size};

    for (size_t i = 0; hashes[i] != NULL; ++i) {
        hashes[i]->final(hashes[i], ch1hash, PTLS_HASH_FINAL_MODE_RESET);
        hashes[i]->update(hashes[i], prefix, sizeof(prefix));
        hashes[i]->update(hashes[i], ch1hash, digest_size);
    }

    ptls_clear_memory(ch1hash, sizeof(ch1hash));
}